

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::average_update<false,1ul,2ul>
                (float total_weight,float normalized_sum_norm_x,float neg_norm_power)

{
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  
  fVar1 = powf(in_XMM1_Da / in_XMM0_Da,in_XMM2_Da);
  return fVar1;
}

Assistant:

float average_update(float total_weight, float normalized_sum_norm_x, float neg_norm_power)
{
  if (normalized)
  {
    if (sqrt_rate)
    {
      float avg_norm = (float)(total_weight / normalized_sum_norm_x);
      if (adaptive)
        return sqrt(avg_norm);
      else
        return avg_norm;
    }
    else
      return powf((float)(normalized_sum_norm_x / total_weight), neg_norm_power);
  }
  return 1.f;
}